

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMyString.cpp
# Opt level: O1

void GenKMPNext(int *next,CMyString *s)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  *next = -1;
  if (1 < s->length) {
    uVar3 = 0xffffffff;
    lVar1 = 0;
    do {
      uVar2 = uVar3;
      if (-1 < (int)uVar3) {
        do {
          if (s->str[lVar1] == s->str[uVar2]) break;
          uVar2 = next[uVar2];
        } while (-1 < (int)uVar2);
      }
      uVar3 = uVar2 + 1;
      uVar4 = uVar3;
      if (s->str[lVar1 + 1] == s->str[(long)(int)uVar2 + 1]) {
        uVar4 = next[(long)(int)uVar2 + 1];
      }
      lVar1 = lVar1 + 1;
      next[lVar1] = uVar4;
    } while (lVar1 < (long)s->length + -1);
  }
  return;
}

Assistant:

void GenKMPNext(int *next,CMyString *s)  //计算next数组
{
    int i = 0, j = -1;
    next[0] = -1;
    while(i < s->length-1)
    {
        //找出p0,p1,...,pi中最大的相同的最左端子串和最右端子串
        while(j>=0 && s->str[i]!=s->str[j]) {
            j = next[j];
        }
        i++; j++;
        if(s->str[i]==s->str[j])
            next[i] = next[j];
        else next[i] = j;
    }
}